

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

void picojson::serialize_str<std::ostream_iterator<char,char,std::char_traits<char>>>
               (string *s,ostream_iterator<char,_char,_std::char_traits<char>_> *oi)

{
  byte bVar1;
  byte *pbVar2;
  byte *__value;
  string local_f0;
  char buf [7];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_b8;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_a8;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_98;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_88;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_78;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_68;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  
  local_f0._M_dataplus._M_p._0_1_ = 0x22;
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(oi,(char *)&local_f0);
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  __value = pbVar2;
  do {
    if (__value == pbVar2 + s->_M_string_length) {
      local_f0._M_dataplus._M_p._0_1_ = 0x22;
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(oi,(char *)&local_f0);
      return;
    }
    bVar1 = *__value;
    switch(bVar1) {
    case 8:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\\b",(allocator<char> *)buf);
      local_78._M_stream = oi->_M_stream;
      local_78._M_string = oi->_M_string;
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_78);
      break;
    case 9:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\\t",(allocator<char> *)buf);
      local_b8._M_stream = oi->_M_stream;
      local_b8._M_string = oi->_M_string;
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_b8);
      break;
    case 10:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\\n",(allocator<char> *)buf);
      local_98._M_stream = oi->_M_stream;
      local_98._M_string = oi->_M_string;
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_98);
      break;
    case 0xb:
switchD_001089f9_caseD_b:
      if (bVar1 < 0x20 || bVar1 == 0x7f) {
        snprintf(buf,7,"\\u%04x");
        std::copy<char*,std::ostream_iterator<char,char,std::char_traits<char>>>
                  ((char *)&local_f0,buf,
                   (ostream_iterator<char,_char,_std::char_traits<char>_> *)(buf + 6));
      }
      else {
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(oi,(char *)__value);
      }
      goto LAB_00108bd1;
    case 0xc:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\\f",(allocator<char> *)buf);
      local_88._M_stream = oi->_M_stream;
      local_88._M_string = oi->_M_string;
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_88);
      break;
    case 0xd:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\\r",(allocator<char> *)buf);
      local_a8._M_stream = oi->_M_stream;
      local_a8._M_string = oi->_M_string;
      copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_a8);
      break;
    default:
      if (bVar1 == 0x5c) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"\\\\",(allocator<char> *)buf);
        local_58._M_stream = oi->_M_stream;
        local_58._M_string = oi->_M_string;
        copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_58);
      }
      else if (bVar1 == 0x2f) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"\\/",(allocator<char> *)buf);
        local_68._M_stream = oi->_M_stream;
        local_68._M_string = oi->_M_string;
        copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_68);
      }
      else {
        if (bVar1 != 0x22) goto switchD_001089f9_caseD_b;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"\\\"",(allocator<char> *)buf);
        local_48._M_stream = oi->_M_stream;
        local_48._M_string = oi->_M_string;
        copy<std::ostream_iterator<char,char,std::char_traits<char>>>(&local_f0,&local_48);
      }
    }
    std::__cxx11::string::~string((string *)&local_f0);
LAB_00108bd1:
    __value = __value + 1;
    pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
	MAP('"', "\\\"");
	MAP('\\', "\\\\");
	MAP('/', "\\/");
	MAP('\b', "\\b");
	MAP('\f', "\\f");
	MAP('\n', "\\n");
	MAP('\r', "\\r");
	MAP('\t', "\\t");
#undef MAP
      default:
	if ((unsigned char)*i < 0x20 || *i == 0x7f) {
	  char buf[7];
	  SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
	  copy(buf, buf + 6, oi);
	  } else {
	  *oi++ = *i;
	}
	break;
      }
    }
    *oi++ = '"';
  }